

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::bin_writer<3>_>
          *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  wchar_t __tmp;
  ulong uVar12;
  int iVar18;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  wchar_t *local_48;
  long local_40;
  ulong local_38;
  
  uVar10 = (ulong)(uint)specs->width;
  uVar8 = f->size_;
  uVar9 = uVar10 - uVar8;
  if (uVar10 < uVar8 || uVar9 == 0) {
    puVar2 = *(undefined8 **)this;
    lVar11 = puVar2[2];
    uVar8 = uVar8 + lVar11;
    if ((ulong)puVar2[3] < uVar8) {
      (**(code **)*puVar2)(puVar2,uVar8);
    }
    puVar2[2] = uVar8;
    local_48 = (wchar_t *)(lVar11 * 4 + puVar2[1]);
    padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                  *)f,&local_48);
  }
  else {
    puVar2 = *(undefined8 **)this;
    lVar11 = puVar2[2];
    uVar12 = lVar11 + uVar10;
    if ((ulong)puVar2[3] < uVar12) {
      local_40 = lVar11;
      local_38 = uVar9;
      (**(code **)*puVar2)(puVar2,uVar12);
      uVar9 = local_38;
      lVar11 = local_40;
    }
    puVar2[2] = uVar12;
    auVar6 = _DAT_001ab3f0;
    auVar5 = _DAT_001ab3e0;
    auVar4 = _DAT_001a7090;
    lVar3 = puVar2[1];
    local_48 = (wchar_t *)(lVar3 + lVar11 * 4);
    wVar1 = (specs->fill).data_[0];
    bVar7 = specs->field_0x9 & 0xf;
    if (bVar7 == 3) {
      uVar12 = uVar9 >> 1;
      if (1 < uVar9) {
        local_48 = local_48 + uVar12;
        uVar9 = uVar12 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar23._8_4_ = (int)uVar9;
        auVar23._0_8_ = uVar9;
        auVar23._12_4_ = (int)(uVar9 >> 0x20);
        lVar3 = lVar3 + lVar11 * 4;
        lVar11 = 0;
        auVar23 = auVar23 ^ _DAT_001a7090;
        do {
          auVar20._8_4_ = (int)lVar11;
          auVar20._0_8_ = lVar11;
          auVar20._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar24 = (auVar20 | auVar6) ^ auVar4;
          iVar18 = auVar23._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar18 && auVar23._0_4_ < auVar24._0_4_ ||
                      iVar18 < auVar24._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar11 * 4) = wVar1;
          }
          if ((auVar24._12_4_ != auVar23._12_4_ || auVar24._8_4_ <= auVar23._8_4_) &&
              auVar24._12_4_ <= auVar23._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar11 * 4) = wVar1;
          }
          auVar20 = (auVar20 | auVar5) ^ auVar4;
          iVar25 = auVar20._4_4_;
          if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar20._0_4_ <= auVar23._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar11 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar11 * 4) = wVar1;
          }
          lVar11 = lVar11 + 4;
        } while ((uVar9 - ((uint)(uVar12 + 0x3fffffffffffffff) & 3)) + 4 != lVar11);
      }
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                    *)f,&local_48);
      auVar6 = _DAT_001ab3f0;
      auVar5 = _DAT_001ab3e0;
      auVar4 = _DAT_001a7090;
      if (uVar10 != uVar8) {
        uVar9 = (uVar10 * 4 + (uVar8 + uVar12) * -4) - 4;
        auVar24._8_4_ = (int)uVar9;
        auVar24._0_8_ = uVar9;
        auVar24._12_4_ = (int)(uVar9 >> 0x20);
        auVar15._0_8_ = uVar9 >> 2;
        auVar15._8_8_ = auVar24._8_8_ >> 2;
        uVar8 = 0;
        auVar15 = auVar15 ^ _DAT_001a7090;
        do {
          auVar21._8_4_ = (int)uVar8;
          auVar21._0_8_ = uVar8;
          auVar21._12_4_ = (int)(uVar8 >> 0x20);
          auVar23 = (auVar21 | auVar6) ^ auVar4;
          iVar18 = auVar15._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar18 && auVar15._0_4_ < auVar23._0_4_ ||
                      iVar18 < auVar23._4_4_) & 1)) {
            local_48[uVar8] = wVar1;
          }
          if ((auVar23._12_4_ != auVar15._12_4_ || auVar23._8_4_ <= auVar15._8_4_) &&
              auVar23._12_4_ <= auVar15._12_4_) {
            local_48[uVar8 + 1] = wVar1;
          }
          auVar23 = (auVar21 | auVar5) ^ auVar4;
          iVar25 = auVar23._4_4_;
          if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar15._0_4_)) {
            local_48[uVar8 + 2] = wVar1;
            local_48[uVar8 + 3] = wVar1;
          }
          uVar8 = uVar8 + 4;
        } while (((uVar9 >> 2) + 4 & 0xfffffffffffffffc) != uVar8);
      }
    }
    else if (bVar7 == 2) {
      if (uVar10 != uVar8) {
        local_48 = local_48 + uVar9;
        uVar9 = (uVar10 * 4 + uVar8 * -4) - 4;
        auVar13._8_4_ = (int)uVar9;
        auVar13._0_8_ = uVar9;
        auVar13._12_4_ = (int)(uVar9 >> 0x20);
        auVar14._0_8_ = uVar9 >> 2;
        auVar14._8_8_ = auVar13._8_8_ >> 2;
        lVar3 = lVar3 + lVar11 * 4;
        uVar8 = 0;
        auVar14 = auVar14 ^ _DAT_001a7090;
        do {
          auVar19._8_4_ = (int)uVar8;
          auVar19._0_8_ = uVar8;
          auVar19._12_4_ = (int)(uVar8 >> 0x20);
          auVar23 = (auVar19 | auVar6) ^ auVar4;
          iVar18 = auVar14._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar18 && auVar14._0_4_ < auVar23._0_4_ ||
                      iVar18 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + uVar8 * 4) = wVar1;
          }
          if ((auVar23._12_4_ != auVar14._12_4_ || auVar23._8_4_ <= auVar14._8_4_) &&
              auVar23._12_4_ <= auVar14._12_4_) {
            *(wchar_t *)(lVar3 + 4 + uVar8 * 4) = wVar1;
          }
          auVar23 = (auVar19 | auVar5) ^ auVar4;
          iVar25 = auVar23._4_4_;
          if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar14._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + uVar8 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + uVar8 * 4) = wVar1;
          }
          uVar8 = uVar8 + 4;
        } while (((uVar9 >> 2) + 4 & 0xfffffffffffffffc) != uVar8);
      }
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                    *)f,&local_48);
    }
    else {
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                    *)f,&local_48);
      auVar6 = _DAT_001ab3f0;
      auVar5 = _DAT_001ab3e0;
      auVar4 = _DAT_001a7090;
      if (uVar10 != uVar8) {
        uVar9 = (uVar10 * 4 + uVar8 * -4) - 4;
        auVar16._8_4_ = (int)uVar9;
        auVar16._0_8_ = uVar9;
        auVar16._12_4_ = (int)(uVar9 >> 0x20);
        auVar17._0_8_ = uVar9 >> 2;
        auVar17._8_8_ = auVar16._8_8_ >> 2;
        uVar8 = 0;
        auVar17 = auVar17 ^ _DAT_001a7090;
        do {
          auVar22._8_4_ = (int)uVar8;
          auVar22._0_8_ = uVar8;
          auVar22._12_4_ = (int)(uVar8 >> 0x20);
          auVar23 = (auVar22 | auVar6) ^ auVar4;
          iVar18 = auVar17._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar18 && auVar17._0_4_ < auVar23._0_4_ ||
                      iVar18 < auVar23._4_4_) & 1)) {
            local_48[uVar8] = wVar1;
          }
          if ((auVar23._12_4_ != auVar17._12_4_ || auVar23._8_4_ <= auVar17._8_4_) &&
              auVar23._12_4_ <= auVar17._12_4_) {
            local_48[uVar8 + 1] = wVar1;
          }
          auVar23 = (auVar22 | auVar5) ^ auVar4;
          iVar25 = auVar23._4_4_;
          if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar17._0_4_)) {
            local_48[uVar8 + 2] = wVar1;
            local_48[uVar8 + 3] = wVar1;
          }
          uVar8 = uVar8 + 4;
        } while (((uVar9 >> 2) + 4 & 0xfffffffffffffffc) != uVar8);
      }
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }